

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffthdu(fitsfile *fptr,int *nhdu,int *status)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int tstatus;
  undefined8 uStack_38;
  
  uVar1 = *status;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  iVar4 = fptr->HDUposition;
  *nhdu = iVar4;
  if (fptr->Fptr->datastart != -1) {
    iVar4 = iVar4 + 1;
    uStack_38 = (ulong)uVar1;
    iVar2 = ffmahd(fptr,iVar4,(int *)0x0,(int *)((long)&uStack_38 + 4));
    if (iVar2 < 1) {
      iVar2 = iVar4;
      do {
        *nhdu = iVar2;
        iVar2 = iVar2 + 1;
        iVar3 = ffmahd(fptr,iVar2,(int *)0x0,(int *)((long)&uStack_38 + 4));
      } while (iVar3 < 1);
    }
    ffmahd(fptr,iVar4,(int *)0x0,status);
  }
  return *status;
}

Assistant:

int ffthdu(fitsfile *fptr,      /* I - FITS file pointer                    */
           int *nhdu,            /* O - number of HDUs in the file           */
           int *status)         /* IO - error status                        */
/*
  Return the number of HDUs that currently exist in the file.
*/
{
    int ii, extnum, tstatus;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1;  /* save the current HDU number */
    *nhdu = extnum - 1;

    /* if the CHDU is empty or not completely defined, just return */
    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        return(*status);

    tstatus = 0;

    /* loop until EOF */
    for (ii=extnum; ffmahd(fptr, ii, 0, &tstatus) <= 0; ii++)
    {
        *nhdu = ii;
    }

    ffmahd(fptr, extnum, 0, status);       /* restore orig file position */
    return(*status);
}